

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_polar_codes.cpp
# Opt level: O2

void lzham::generate_polar_codes
               (uint num_syms,sym_freq_conflict *pSF,uint8 *pCodesizes,uint *max_code_size_ret)

{
  uint uVar1;
  long lVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  int tmp_freq [600];
  
  lVar2 = (ulong)num_syms * 4;
  uVar11 = num_syms - 1;
  uVar12 = 0;
  uVar10 = 0;
  for (lVar13 = 0; lVar2 != lVar13; lVar13 = lVar13 + 4) {
    uVar10 = uVar10 + pSF[uVar11].m_freq;
    uVar4 = math::total_bits((uint)pSF[uVar11].m_freq);
    iVar5 = 1 << ((char)uVar4 - 1U & 0x1f);
    *(int *)((long)tmp_freq + lVar13) = iVar5;
    uVar12 = uVar12 + iVar5;
    uVar11 = uVar11 - 1;
  }
  uVar4 = math::total_bits(uVar10);
  bVar6 = (char)uVar4 - 1;
  bVar3 = bVar6 & 0x1f;
  uVar11 = 1 << bVar3;
  uVar4 = 2 << (bVar6 & 0x1f);
  if (uVar10 <= uVar11) {
    uVar4 = uVar11;
  }
  uVar11 = 0 << bVar3;
LAB_0011bd16:
  do {
    if ((uVar4 <= uVar12) || (num_syms <= uVar11)) {
      uVar10 = math::total_bits(uVar4);
      uVar12 = num_syms - 1;
      uVar11 = 0;
      for (lVar13 = 0; lVar2 != lVar13; lVar13 = lVar13 + 4) {
        uVar4 = math::total_bits(*(uint *)((long)tmp_freq + lVar13));
        uVar7 = uVar10 - uVar4;
        if (uVar11 < uVar7) {
          uVar11 = uVar7;
        }
        pCodesizes[pSF[uVar12].m_sym] = (uint8)uVar7;
        uVar12 = uVar12 - 1;
      }
      *max_code_size_ret = uVar11;
      return;
    }
    uVar7 = uVar12;
    uVar9 = (ulong)uVar11;
    do {
      while( true ) {
        uVar8 = uVar9 + 1;
        uVar12 = uVar7;
        if (num_syms <= uVar9) goto LAB_0011bd16;
        uVar1 = tmp_freq[uVar9] + uVar7;
        if (uVar1 <= uVar4) break;
        uVar11 = (uint)uVar8;
        uVar9 = uVar8;
      }
      tmp_freq[uVar9] = tmp_freq[uVar9] * 2;
      uVar12 = uVar4;
      uVar7 = uVar1;
      uVar9 = uVar8;
    } while (uVar1 != uVar4);
  } while( true );
}

Assistant:

void generate_polar_codes(uint num_syms, sym_freq* pSF, uint8* pCodesizes, uint& max_code_size_ret)
   {
      int tmp_freq[cPolarMaxSupportedSyms];

      uint orig_total_freq = 0;
      uint cur_total = 0;
      for (uint i = 0; i < num_syms; i++) 
      {
         uint sym_freq = pSF[num_syms - 1 - i].m_freq;
         orig_total_freq += sym_freq;

         uint sym_len = math::total_bits(sym_freq);
         uint adjusted_sym_freq = 1 << (sym_len - 1);
         tmp_freq[i] = adjusted_sym_freq;
         cur_total += adjusted_sym_freq;
      }

      uint tree_total = 1 << (math::total_bits(orig_total_freq) - 1);
      if (tree_total < orig_total_freq)
         tree_total <<= 1;

      uint start_index = 0;
      while ((cur_total < tree_total) && (start_index < num_syms))
      {
         for (uint i = start_index; i < num_syms; i++) 
         {
            uint freq = tmp_freq[i];
            if ((cur_total + freq) <= tree_total) 
            {
               tmp_freq[i] += freq;
               if ((cur_total += freq) == tree_total)
                  break;
            }
            else 
            {
               start_index = i + 1;
            }
         }
      }         

      LZHAM_ASSERT(cur_total == tree_total);

      uint max_code_size = 0;
      const uint tree_total_bits = math::total_bits(tree_total);
      for (uint i = 0; i < num_syms; i++) 
      {
         uint codesize = (tree_total_bits - math::total_bits(tmp_freq[i]));
         max_code_size = LZHAM_MAX(codesize, max_code_size);
         pCodesizes[pSF[num_syms-1-i].m_sym] = static_cast<uint8>(codesize);
      }
      max_code_size_ret = max_code_size;
   }